

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O1

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
               (Op op,SquareMatrix<std::complex<double>_> *A)

{
  long lVar1;
  complex<double> *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int64_t j;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  if (op != NoTrans) {
    lVar1 = A->size_;
    if (0 < lVar1 && op == ConjTrans) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        lVar8 = 8;
        lVar9 = lVar1;
        do {
          lVar10 = A->size_ * lVar6;
          pcVar2 = (A->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
          *(ulong *)(pcVar2->_M_value + lVar8 + lVar10) =
               *(ulong *)(pcVar2->_M_value + lVar8 + lVar10) ^ 0x8000000000000000;
          lVar8 = lVar8 + 0x10;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 != lVar1);
    }
    if (1 < lVar1) {
      lVar7 = 0x10;
      lVar9 = 0;
      lVar6 = 0;
      do {
        lVar8 = lVar6 + 1;
        lVar10 = lVar7;
        do {
          pcVar2 = (A->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
          lVar11 = lVar9 * A->size_;
          lVar12 = A->size_ * lVar8;
          uVar3 = *(undefined8 *)(pcVar2->_M_value + lVar10 + lVar11);
          uVar4 = *(undefined8 *)((long)(pcVar2->_M_value + lVar10 + lVar11) + 8);
          uVar5 = *(undefined8 *)(pcVar2[lVar12 + lVar6]._M_value + 8);
          *(undefined8 *)(pcVar2->_M_value + lVar10 + lVar11) =
               *(undefined8 *)pcVar2[lVar12 + lVar6]._M_value;
          *(undefined8 *)((long)(pcVar2->_M_value + lVar10 + lVar11) + 8) = uVar5;
          *(undefined8 *)pcVar2[lVar12 + lVar6]._M_value = uVar3;
          *(undefined8 *)(pcVar2[lVar12 + lVar6]._M_value + 8) = uVar4;
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar8 < lVar1);
        lVar9 = lVar9 + 0x10;
        lVar7 = lVar7 + 0x10;
        bVar13 = lVar6 != lVar1 + -2;
        lVar6 = lVar6 + 1;
      } while (bVar13);
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }